

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_cookie.c
# Opt level: O0

ares_status_t
ares_cookie_validate
          (ares_query_t *query,ares_dns_record_t *dnsresp,ares_conn_t *conn,ares_timeval_t *now,
          ares_array_t **requeue)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  ares_dns_rcode_t aVar5;
  ares_bool_t aVar6;
  size_t local_70;
  size_t req_cookie_len;
  uchar *req_cookie;
  size_t resp_cookie_len;
  uchar *resp_cookie;
  ares_dns_record_t *dnsreq;
  ares_cookie_t *cookie;
  ares_server_t *server;
  ares_array_t **requeue_local;
  ares_timeval_t *now_local;
  ares_conn_t *conn_local;
  ares_dns_record_t *dnsresp_local;
  ares_query_t *query_local;
  
  cookie = (ares_cookie_t *)conn->server;
  dnsreq = (ares_dns_record_t *)&((ares_server_t *)cookie)->cookie;
  resp_cookie = (uchar *)query->query;
  server = (ares_server_t *)requeue;
  requeue_local = (ares_array_t **)now;
  now_local = (ares_timeval_t *)conn;
  conn_local = (ares_conn_t *)dnsresp;
  dnsresp_local = (ares_dns_record_t *)query;
  resp_cookie_len = (size_t)ares_dns_cookie_fetch(dnsresp,(size_t *)&req_cookie);
  if (((uchar *)resp_cookie_len == (uchar *)0x0) ||
     (((uchar *)0x7 < req_cookie && (req_cookie < (uchar *)0x29)))) {
    req_cookie_len = (size_t)ares_dns_cookie_fetch((ares_dns_record_t *)resp_cookie,&local_70);
    if ((long *)req_cookie_len == (long *)0x0) {
      query_local._4_4_ = ARES_SUCCESS;
    }
    else if ((resp_cookie_len == 0) || (*(long *)req_cookie_len == *(long *)resp_cookie_len)) {
      if ((resp_cookie_len != 0) && ((uchar *)0x8 < req_cookie)) {
        dnsreq->id = 2;
        dnsreq->flags = 0;
        memset(&dnsreq[1].ns,0,0x10);
        lVar3._0_4_ = dnsreq->opcode;
        lVar3._4_4_ = dnsreq->rcode;
        if (lVar3 == *(long *)req_cookie_len) {
          dnsreq[1].an = (ares_array_t *)(req_cookie + -8);
          memcpy((void *)((long)&dnsreq->ar + 4),(void *)(resp_cookie_len + 8),(size_t)dnsreq[1].an)
          ;
        }
      }
      aVar5 = ares_dns_record_get_rcode((ares_dns_record_t *)conn_local);
      if (aVar5 == ARES_RCODE_BADCOOKIE) {
        if (resp_cookie_len == 0) {
          query_local._4_4_ = ARES_EBADRESP;
        }
        else {
          *(long *)(dnsresp_local + 2) = *(long *)(dnsresp_local + 2) + 1;
          uVar4._0_2_ = dnsresp_local[2].id;
          uVar4._2_2_ = dnsresp_local[2].flags;
          uVar4._4_4_ = dnsresp_local[2].opcode;
          if (2 < uVar4) {
            dnsresp_local[2].rcode = ARES_RCODE_FORMERR;
          }
          ares_requeue_query((ares_query_t *)dnsresp_local,(ares_timeval_t *)requeue_local,
                             ARES_SUCCESS,ARES_FALSE,(ares_dns_record_t *)0x0,
                             (ares_array_t **)server);
          query_local._4_4_ = ARES_EBADRESP;
        }
      }
      else if (req_cookie < (uchar *)0x9) {
        iVar1._0_2_ = dnsreq->id;
        iVar1._2_2_ = dnsreq->flags;
        if (iVar1 == 2) {
          aVar6 = timeval_is_set((ares_timeval_t *)&dnsreq[1].ns);
          if (aVar6 == ARES_FALSE) {
            dnsreq[1].ns = *requeue_local;
            dnsreq[1].ar = requeue_local[1];
          }
          query_local._4_4_ = ARES_EBADRESP;
        }
        else {
          iVar2._0_2_ = dnsreq->id;
          iVar2._2_2_ = dnsreq->flags;
          if (iVar2 == 1) {
            ares_cookie_clear((ares_cookie_t *)dnsreq);
            dnsreq->id = 3;
            dnsreq->flags = 0;
            dnsreq[1].ns = *requeue_local;
            dnsreq[1].ar = requeue_local[1];
          }
          query_local._4_4_ = ARES_SUCCESS;
        }
      }
      else {
        query_local._4_4_ = ARES_SUCCESS;
      }
    }
    else {
      query_local._4_4_ = ARES_EBADRESP;
    }
  }
  else {
    query_local._4_4_ = ARES_EBADRESP;
  }
  return query_local._4_4_;
}

Assistant:

ares_status_t ares_cookie_validate(ares_query_t            *query,
                                   const ares_dns_record_t *dnsresp,
                                   ares_conn_t *conn, const ares_timeval_t *now,
                                   ares_array_t **requeue)
{
  ares_server_t           *server = conn->server;
  ares_cookie_t           *cookie = &server->cookie;
  const ares_dns_record_t *dnsreq = query->query;
  const unsigned char     *resp_cookie;
  size_t                   resp_cookie_len;
  const unsigned char     *req_cookie;
  size_t                   req_cookie_len;

  resp_cookie = ares_dns_cookie_fetch(dnsresp, &resp_cookie_len);

  /* Invalid cookie length, drop */
  if (resp_cookie && (resp_cookie_len < 8 || resp_cookie_len > 40)) {
    return ARES_EBADRESP;
  }

  req_cookie = ares_dns_cookie_fetch(dnsreq, &req_cookie_len);

  /* Didn't request cookies, so we can stop evaluating */
  if (req_cookie == NULL) {
    return ARES_SUCCESS;
  }

  /* If 8-byte prefix for returned cookie doesn't match the requested cookie,
   * drop for spoofing */
  if (resp_cookie && memcmp(req_cookie, resp_cookie, 8) != 0) {
    return ARES_EBADRESP;
  }

  if (resp_cookie && resp_cookie_len > 8) {
    /* Make sure we record that we successfully received a cookie response */
    cookie->state = ARES_COOKIE_SUPPORTED;
    memset(&cookie->unsupported_ts, 0, sizeof(cookie->unsupported_ts));

    /* If client cookie hasn't been rotated, save the returned server cookie */
    if (memcmp(cookie->client, req_cookie, sizeof(cookie->client)) == 0) {
      cookie->server_len = resp_cookie_len - 8;
      memcpy(cookie->server, resp_cookie + 8, cookie->server_len);
    }
  }

  if (ares_dns_record_get_rcode(dnsresp) == ARES_RCODE_BADCOOKIE) {
    /* Illegal to return BADCOOKIE but no cookie, drop */
    if (resp_cookie == NULL) {
      return ARES_EBADRESP;
    }

    /* If we have too many attempts to send a cookie, we need to requeue as
     * tcp */
    query->cookie_try_count++;
    if (query->cookie_try_count >= COOKIE_RESEND_MAX) {
      query->using_tcp = ARES_TRUE;
    }

    /* Resend the request, hopefully it will work the next time as we should
     * have recorded a server cookie */
    ares_requeue_query(query, now, ARES_SUCCESS,
                       ARES_FALSE /* Don't increment try count */, NULL,
                       requeue);

    /* Parent needs to drop this response */
    return ARES_EBADRESP;
  }

  /* We've got a response with a server cookie, and we've done all the
   * evaluation we can, return success */
  if (resp_cookie_len > 8) {
    return ARES_SUCCESS;
  }

  if (cookie->state == ARES_COOKIE_SUPPORTED) {
    /* If we're not currently tracking an error time yet, start */
    if (!timeval_is_set(&cookie->unsupported_ts)) {
      memcpy(&cookie->unsupported_ts, now, sizeof(cookie->unsupported_ts));
    }
    /* Drop it since we expected a cookie */
    return ARES_EBADRESP;
  }

  if (cookie->state == ARES_COOKIE_GENERATED) {
    ares_cookie_clear(cookie);
    cookie->state = ARES_COOKIE_UNSUPPORTED;
    memcpy(&cookie->unsupported_ts, now, sizeof(cookie->unsupported_ts));
  }

  /* Cookie state should be UNSUPPORTED if we're here */
  return ARES_SUCCESS;
}